

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlRenderer::RecordSingleMemberClasses
          (GdlRenderer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vstaSingleMemberClasses,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vstaFiles,vector<int,_std::allocator<int>_> *vnLines,string *staPathToCur)

{
  ulong uVar1;
  size_type_conflict sVar2;
  long in_RDI;
  string *in_R8;
  string *in_stack_00000060;
  vector<int,_std::allocator<int>_> *in_stack_00000068;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000070;
  size_t ipglfc;
  string local_50 [32];
  ulong local_30;
  
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    sVar2 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size
                      ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)
                       (in_RDI + 0x40));
    if (sVar2 <= uVar1) break;
    std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
              ((vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *)(in_RDI + 0x40),
               local_30);
    std::__cxx11::string::string(local_50,in_R8);
    GdlGlyphClassDefn::RecordSingleMemberClasses
              ((GdlGlyphClassDefn *)staPathToCur,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ipglfc,in_stack_00000070,in_stack_00000068,in_stack_00000060);
    std::__cxx11::string::~string(local_50);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void GdlRenderer::RecordSingleMemberClasses(std::vector<std::string> & vstaSingleMemberClasses,
	std::vector<std::string> & vstaFiles, std::vector<int> & vnLines, std::string staPathToCur)
{
	for (size_t ipglfc = 0; ipglfc < m_vpglfc.size(); ipglfc++)
	{
		m_vpglfc[ipglfc]->RecordSingleMemberClasses(vstaSingleMemberClasses, vstaFiles, vnLines,
			staPathToCur);
	}
}